

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O2

maybe<(anonymous_namespace)::value,_void> * __thiscall
pstore::maybe<(anonymous_namespace)::value,void>::operator=
          (maybe<(anonymous_namespace)::value,void> *this,value *other)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *this_00;
  value __tmp;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (*this == (maybe<(anonymous_namespace)::value,void>)0x1) {
    local_48._M_ptr = (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48._M_refcount._M_pi =
         (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    this_00 = (__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)
              maybe<(anonymous_namespace)::value,_void>::value
                        ((maybe<(anonymous_namespace)::value,_void> *)this);
    local_38._M_ptr = this_00->_M_ptr;
    local_38._M_refcount._M_pi = (this_00->_M_refcount)._M_pi;
    (this_00->_M_refcount)._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00->_M_ptr = (element_type *)0x0;
    std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&local_48);
    std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_48,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  else {
    *(undefined8 *)(this + 0x10) = 0;
    peVar1 = (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)(this + 8) = peVar1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x10) = p_Var2;
    (other->v_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    *this = (maybe<(anonymous_namespace)::value,void>)0x1;
  }
  return (maybe<(anonymous_namespace)::value,_void> *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }